

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

int cm_zlib__tr_tally(deflate_state *s,uint dist,uint lc)

{
  byte bVar1;
  uint uVar2;
  uint local_24;
  uint lc_local;
  uint dist_local;
  deflate_state *s_local;
  
  s->d_buf[s->last_lit] = (ushf)dist;
  uVar2 = s->last_lit;
  s->last_lit = uVar2 + 1;
  s->l_buf[uVar2] = (uchf)lc;
  if (dist == 0) {
    s->dyn_ltree[lc].fc.freq = s->dyn_ltree[lc].fc.freq + 1;
  }
  else {
    s->matches = s->matches + 1;
    uVar2 = dist - 1;
    s->dyn_ltree[(int)(""[lc] + 0x101)].fc.freq = s->dyn_ltree[(int)(""[lc] + 0x101)].fc.freq + 1;
    if (uVar2 < 0x100) {
      bVar1 = ""[uVar2];
    }
    else {
      bVar1 = ""[(uVar2 >> 7) + 0x100];
    }
    local_24 = (uint)bVar1;
    s->dyn_dtree[(int)local_24].fc.freq = s->dyn_dtree[(int)local_24].fc.freq + 1;
  }
  return (int)(s->last_lit == s->lit_bufsize - 1);
}

Assistant:

int _tr_tally (s, dist, lc)
    deflate_state *s;
    unsigned dist;  /* distance of matched string */
    unsigned lc;    /* match length-MIN_MATCH or unmatched char (if dist==0) */
{
    s->d_buf[s->last_lit] = (ush)dist;
    s->l_buf[s->last_lit++] = (uch)lc;
    if (dist == 0) {
        /* lc is the unmatched char */
        s->dyn_ltree[lc].Freq++;
    } else {
        s->matches++;
        /* Here, lc is the match length - MIN_MATCH */
        dist--;             /* dist = match distance - 1 */
        Assert((ush)dist < (ush)MAX_DIST(s) &&
               (ush)lc <= (ush)(MAX_MATCH-MIN_MATCH) &&
               (ush)d_code(dist) < (ush)D_CODES,  "_tr_tally: bad match");

        s->dyn_ltree[_length_code[lc]+LITERALS+1].Freq++;
        s->dyn_dtree[d_code(dist)].Freq++;
    }

#ifdef TRUNCATE_BLOCK
    /* Try to guess if it is profitable to stop the current block here */
    if ((s->last_lit & 0x1fff) == 0 && s->level > 2) {
        /* Compute an upper bound for the compressed length */
        ulg out_length = (ulg)s->last_lit*8L;
        ulg in_length = (ulg)((long)s->strstart - s->block_start);
        int dcode;
        for (dcode = 0; dcode < D_CODES; dcode++) {
            out_length += (ulg)s->dyn_dtree[dcode].Freq *
                (5L+extra_dbits[dcode]);
        }
        out_length >>= 3;
        Tracev((stderr,"\nlast_lit %u, in %ld, out ~%ld(%ld%%) ",
               s->last_lit, in_length, out_length,
               100L - out_length*100L/in_length));
        if (s->matches < s->last_lit/2 && out_length < in_length/2) return 1;
    }
#endif
    return (s->last_lit == s->lit_bufsize-1);
    /* We avoid equality with lit_bufsize because of wraparound at 64K
     * on 16 bit machines and because stored blocks are restricted to
     * 64K-1 bytes.
     */
}